

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall
wasm::TranslateToFuzzReader::makeStringMeasure(TranslateToFuzzReader *this,Type type)

{
  Expression *pEVar1;
  Expression *pEVar2;
  
  if (type.id == 2) {
    pEVar1 = makeTrappingRefUse(this,(HeapType)0x50);
    pEVar2 = (Expression *)MixedArena::allocSpace(&((this->builder).wasm)->allocator,0x20,8);
    pEVar2->_id = StringMeasureId;
    (pEVar2->type).id = 0;
    *(undefined4 *)(pEVar2 + 1) = 1;
    pEVar2[1].type.id = (uintptr_t)pEVar1;
    wasm::StringMeasure::finalize();
    return pEVar2;
  }
  __assert_fail("type == Type::i32",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/fuzzing/fuzzing.cpp"
                ,0xeaa,"Expression *wasm::TranslateToFuzzReader::makeStringMeasure(Type)");
}

Assistant:

Expression* TranslateToFuzzReader::makeStringMeasure(Type type) {
  assert(type == Type::i32);

  auto* ref = makeTrappingRefUse(HeapType::string);
  return builder.makeStringMeasure(StringMeasureWTF16, ref);
}